

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O2

void __thiscall
cfd::js::api::json::PrivkeyData::ConvertFromStruct(PrivkeyData *this,PrivkeyDataStruct *data)

{
  std::__cxx11::string::_M_assign((string *)&this->privkey_);
  this->wif_ = data->wif;
  std::__cxx11::string::_M_assign((string *)&this->network_);
  this->is_compressed_ = data->is_compressed;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void PrivkeyData::ConvertFromStruct(
    const PrivkeyDataStruct& data) {
  privkey_ = data.privkey;
  wif_ = data.wif;
  network_ = data.network;
  is_compressed_ = data.is_compressed;
  ignore_items = data.ignore_items;
}